

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveTrailingPathSeparator
          (FilePath *__return_storage_ptr__,FilePath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  _Alloc_hider local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  sVar2 = (this->pathname_)._M_string_length;
  if (sVar2 == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = (this->pathname_)._M_dataplus._M_p[sVar2 - 1] == '/';
  }
  if (bVar4) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
    paVar1 = &(__return_storage_ptr__->pathname_).field_2;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_40._M_p == &local_30) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
      *(undefined8 *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = uStack_28;
    }
    else {
      (__return_storage_ptr__->pathname_)._M_dataplus._M_p = local_40._M_p;
      (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity =
           CONCAT71(uStack_2f,local_30);
    }
    (__return_storage_ptr__->pathname_)._M_string_length = local_38;
    local_38 = 0;
    local_30 = '\0';
    local_40._M_p = &local_30;
    Normalize(__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar3 = (this->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  }
  if ((bVar4) && (local_40._M_p != &local_30)) {
    operator_delete(local_40._M_p,CONCAT71(uStack_2f,local_30) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory() ? FilePath(pathname_.substr(0, pathname_.length() - 1))
                       : *this;
}